

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# peglib.h
# Opt level: O2

shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>_>
 __thiscall
peg::ParserGenerator::perform_core
          (ParserGenerator *this,char *s,size_t n,Rules *rules,string *start,
          bool *enablePackratParsing,Log log)

{
  _Base_ptr p_Var1;
  Log log_00;
  bool bVar2;
  mapped_type *pmVar3;
  mapped_type *__args_2;
  size_type sVar4;
  size_type sVar5;
  mapped_type *pmVar6;
  _Base_ptr p_Var7;
  unsigned_long uVar8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  iterator __begin3;
  pointer ppVar9;
  long lVar10;
  __node_base *p_Var11;
  _Base_ptr __lhs;
  __node_base *p_Var12;
  ReferenceChecker *this_00;
  __node_base *p_Var13;
  iterator __begin3_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  pair<unsigned_long,_unsigned_long> pVar15;
  shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>_>
  sVar16;
  undefined8 in_stack_fffffffffffffc50;
  _Invoker_type in_stack_fffffffffffffc60;
  pointer ppVar17;
  string *this_01;
  undefined1 local_37a;
  undefined1 local_379;
  undefined1 local_378 [40];
  ReferenceChecker vis;
  unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  referenced;
  undefined1 local_250 [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  undefined1 local_220 [8];
  Result r;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_190;
  function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_170;
  Data data;
  function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  local_50;
  
  local_378._32_8_ = s;
  local_220 = (undefined1  [8])enablePackratParsing;
  Data::Data(&data);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vis,"%recover",(allocator<char> *)&r);
  pmVar3 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)data.grammar.
                           super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
                           ._M_ptr,(key_type *)&vis);
  std::__cxx11::string::~string((string *)&vis);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vis,"x",(allocator<char> *)local_378);
  r.ret = false;
  r.recovered = false;
  r._2_6_ = 0;
  r.len = 0;
  r.error_info.error_pos = (char *)0x0;
  ref((Grammar *)&referenced,
      (string *)
      data.grammar.
      super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr,(char *)&vis,true,
      (vector<std::shared_ptr<peg::Ope>,_std::allocator<std::shared_ptr<peg::Ope>_>_> *)0x0);
  Definition::operator<=(pmVar3,(shared_ptr<peg::Ope> *)&referenced);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&referenced._M_h._M_bucket_count);
  std::vector<std::shared_ptr<peg::Ope>,_std::allocator<std::shared_ptr<peg::Ope>_>_>::~vector
            ((vector<std::shared_ptr<peg::Ope>,_std::allocator<std::shared_ptr<peg::Ope>_>_> *)&r);
  std::__cxx11::string::~string((string *)&vis);
  std::__cxx11::string::assign((char *)pmVar3);
  pmVar3->s_ = "[native]";
  pmVar3->ignoreSemanticValue = true;
  pmVar3->is_macro = true;
  std::__cxx11::string::string<std::allocator<char>>((string *)&vis,"x",(allocator<char> *)&r);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  _M_assign_aux<std::__cxx11::string_const*>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&pmVar3->params,
             &vis,&vis.error_s._M_h._M_element_count);
  std::__cxx11::string::~string((string *)&vis);
  local_250._0_8_ = std::any::_Manager_internal<peg::ParserGenerator::Data_*>::_S_manage;
  local_250._8_8_ = &data;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&vis,"Grammar",(allocator<char> *)&referenced);
  pmVar3 = std::__detail::
           _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
           ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                         *)local_378._32_8_,(key_type *)&vis);
  std::
  function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::function(&local_170,
             (function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)log.super__Function_base._M_functor._8_8_);
  log_00.super__Function_base._M_functor._8_8_ = in_stack_fffffffffffffc50;
  log_00.super__Function_base._M_functor._M_unused._M_object = &local_170;
  log_00.super__Function_base._M_manager = (_Manager_type)n;
  log_00._M_invoker = in_stack_fffffffffffffc60;
  Definition::parse(&r,pmVar3,(char *)n,(size_t)rules,(any *)local_250,(char *)0x0,log_00);
  std::_Function_base::~_Function_base(&local_170.super__Function_base);
  std::__cxx11::string::~string((string *)&vis);
  if (r.ret == false) {
    if (*(long *)(log.super__Function_base._M_functor._8_8_ + 0x10) != 0) {
      if (r.error_info.message_pos == (char *)0x0) {
        pVar15 = line_info((char *)n,r.error_info.error_pos);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&vis,"syntax error",(allocator<char> *)&referenced);
        std::
        function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::operator()((function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)log.super__Function_base._M_functor._8_8_,pVar15.first,pVar15.second,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vis,
                     &r.error_info.label);
        this_00 = &vis;
        goto LAB_00112de1;
      }
      pVar15 = line_info((char *)n,r.error_info.message_pos);
      std::
      function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
      ::operator()((function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)log.super__Function_base._M_functor._8_8_,pVar15.first,pVar15.second,
                   &r.error_info.message,&r.error_info.label);
    }
  }
  else {
    paVar14 = &start->field_2;
    while (paVar14 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)paVar14->_M_allocated_capacity,
          paVar14 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0) {
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<peg::Ope>_>
      ::pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<peg::Ope>_>
              *)&vis,(pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<peg::Ope>_>
                      *)((long)paVar14 + 8));
      std::__cxx11::string::string((string *)&referenced,(string *)&vis);
      if (referenced._M_h._M_bucket_count != 0) {
        if (*(char *)referenced._M_h._M_buckets == '~') {
          std::__cxx11::string::erase((ulong)&referenced,0);
          bVar2 = true;
          if (referenced._M_h._M_bucket_count == 0) goto LAB_00112638;
        }
        else {
          bVar2 = false;
        }
        pmVar3 = std::__detail::
                 _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                 ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                               *)data.grammar.
                                 super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr,(key_type *)&referenced);
        Definition::operator<=(pmVar3,(shared_ptr<peg::Ope> *)&vis.error_s._M_h._M_element_count);
        std::__cxx11::string::_M_assign((string *)pmVar3);
        pmVar3->ignoreSemanticValue = bVar2;
      }
LAB_00112638:
      std::__cxx11::string::~string((string *)&referenced);
      std::
      pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<peg::Ope>_>
      ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<peg::Ope>_>
               *)&vis);
    }
    if (data.duplicates_of_definition.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        data.duplicates_of_definition.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      bVar2 = true;
    }
    else {
      ppVar17 = data.duplicates_of_definition.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar9 = data.duplicates_of_definition.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppVar9 != ppVar17;
          ppVar9 = ppVar9 + 1) {
        if (*(long *)(log.super__Function_base._M_functor._8_8_ + 0x10) != 0) {
          pVar15 = line_info((char *)n,ppVar9->second);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &referenced,"The definition \'",&ppVar9->first);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vis,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &referenced,"\' is already defined.");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_378,"",(allocator<char> *)&local_240);
          std::
          function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::operator()((function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)log.super__Function_base._M_functor._8_8_,pVar15.first,pVar15.second,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vis,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_378);
          std::__cxx11::string::~string((string *)local_378);
          std::__cxx11::string::~string((string *)&vis);
          std::__cxx11::string::~string((string *)&referenced);
        }
      }
      bVar2 = false;
    }
    if (data.duplicates_of_instruction.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        data.duplicates_of_instruction.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ppVar17 = data.duplicates_of_instruction.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar9 = data.duplicates_of_instruction.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppVar9 != ppVar17;
          ppVar9 = ppVar9 + 1) {
        if (*(long *)(log.super__Function_base._M_functor._8_8_ + 0x10) != 0) {
          pVar15 = line_info((char *)n,ppVar9->second);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &referenced,"The instruction \'",&ppVar9->first);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vis,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &referenced,"\' is already defined.");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_378,"",(allocator<char> *)&local_240);
          std::
          function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::operator()((function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)log.super__Function_base._M_functor._8_8_,pVar15.first,pVar15.second,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vis,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_378);
          std::__cxx11::string::~string((string *)local_378);
          std::__cxx11::string::~string((string *)&vis);
          std::__cxx11::string::~string((string *)&referenced);
        }
      }
      bVar2 = false;
    }
    if (data.undefined_back_references.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
        ._M_impl.super__Vector_impl_data._M_start !=
        data.undefined_back_references.
        super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) {
      ppVar17 = data.undefined_back_references.
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppVar9 = data.undefined_back_references.
                    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_const_char_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start; ppVar9 != ppVar17;
          ppVar9 = ppVar9 + 1) {
        if (*(long *)(log.super__Function_base._M_functor._8_8_ + 0x10) != 0) {
          pVar15 = line_info((char *)n,ppVar9->second);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &referenced,"The back reference \'",&ppVar9->first);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vis,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &referenced,"\' is undefined.");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_378,"",(allocator<char> *)&local_240);
          std::
          function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::operator()((function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)log.super__Function_base._M_functor._8_8_,pVar15.first,pVar15.second,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vis,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_378);
          std::__cxx11::string::~string((string *)local_378);
          std::__cxx11::string::~string((string *)&vis);
          std::__cxx11::string::~string((string *)&referenced);
        }
      }
      bVar2 = false;
    }
    pmVar3 = std::__detail::
             _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
             ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                           *)data.grammar.
                             super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr,&data.start);
    if (pmVar3->ignoreSemanticValue == true) {
      if (*(long *)(log.super__Function_base._M_functor._8_8_ + 0x10) != 0) {
        pVar15 = line_info((char *)n,pmVar3->s_);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &referenced,"Ignore operator cannot be applied to \'",&pmVar3->name);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vis,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &referenced,"\'.");
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)local_378,"",(allocator<char> *)&local_240);
        std::
        function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
        ::operator()((function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)log.super__Function_base._M_functor._8_8_,pVar15.first,pVar15.second,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vis,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_378)
        ;
        std::__cxx11::string::~string((string *)local_378);
        std::__cxx11::string::~string((string *)&vis);
        this_00 = (ReferenceChecker *)&referenced;
LAB_00112de1:
        std::__cxx11::string::~string((string *)this_00);
      }
    }
    else if (bVar2) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&vis,"%whitespace",(allocator<char> *)local_378);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&vis.error_s._M_h._M_element_count,"%word",(allocator<char> *)&local_240)
      ;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&vis.error_message,"%recover",(allocator<char> *)&local_190);
      std::__cxx11::string::string
                ((string *)&vis.error_message._M_h._M_rehash_policy,(string *)pmVar3);
      std::
      _Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
      ::_Hashtable<std::__cxx11::string_const*>
                ((_Hashtable<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                  *)&referenced,&vis,&vis.referenced._M_h._M_bucket_count,0,&stack0xfffffffffffffc57
                 ,&local_379,&local_37a);
      lVar10 = 0x60;
      do {
        std::__cxx11::string::~string((string *)((long)&vis.super_Visitor._vptr_Visitor + lVar10));
        lVar10 = lVar10 + -0x20;
      } while (lVar10 != -0x20);
      p_Var12 = &((data.grammar.
                   super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr)->_M_h)._M_before_begin;
      p_Var11 = p_Var12;
      while( true ) {
        p_Var13 = &vis.error_s._M_h._M_before_begin;
        p_Var11 = p_Var11->_M_nxt;
        if (p_Var11 == (__node_base *)0x0) break;
        vis.params_ = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)(p_Var11 + 0x23);
        vis.super_Visitor._vptr_Visitor = (_func_int **)&PTR__ReferenceChecker_0016a798;
        vis.error_s._M_h._M_buckets = &vis.error_s._M_h._M_single_bucket;
        vis.error_s._M_h._M_bucket_count = 1;
        vis.error_s._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        vis.error_s._M_h._M_element_count = 0;
        vis.error_s._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        vis.error_s._M_h._M_rehash_policy._M_next_resize = 0;
        vis.error_s._M_h._M_single_bucket = (__node_base_ptr)0x0;
        vis.error_message._M_h._M_buckets = &vis.error_message._M_h._M_single_bucket;
        vis.error_message._M_h._M_bucket_count = 1;
        vis.error_message._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        vis.error_message._M_h._M_element_count = 0;
        vis.error_message._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        vis.error_message._M_h._M_rehash_policy._M_next_resize = 0;
        vis.error_message._M_h._M_single_bucket = (__node_base_ptr)0x0;
        vis.referenced._M_h._M_buckets = &vis.referenced._M_h._M_single_bucket;
        vis.referenced._M_h._M_bucket_count = 1;
        vis.referenced._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
        vis.referenced._M_h._M_element_count = 0;
        vis.referenced._M_h._M_rehash_policy._M_max_load_factor = 1.0;
        vis.referenced._M_h._M_rehash_policy._M_next_resize = 0;
        vis.referenced._M_h._M_single_bucket = (__node_base_ptr)0x0;
        vis.grammar_ = data.grammar.
                       super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr;
        (*(code *)(p_Var11[0x3d]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var11[0x3d]._M_nxt,&vis);
        std::__detail::
        _Insert_base<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
        ::insert<std::__detail::_Node_iterator<std::__cxx11::string,true,true>>
                  ((_Insert_base<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
                    *)&referenced,
                   (_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                    )vis.referenced._M_h._M_before_begin._M_nxt,
                   (_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
                    )0x0);
        while (p_Var13 = p_Var13->_M_nxt, p_Var13 != (__node_base *)0x0) {
          bVar2 = false;
          if (*(long *)(log.super__Function_base._M_functor._8_8_ + 0x10) != 0) {
            pVar15 = line_info((char *)n,(char *)p_Var13[5]._M_nxt);
            __args_2 = std::__detail::
                       _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&vis.error_message,(key_type *)(p_Var13 + 1));
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)local_378,"",(allocator<char> *)&local_240);
            std::
            function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::operator()((function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)log.super__Function_base._M_functor._8_8_,pVar15.first,pVar15.second,
                         __args_2,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)local_378);
            std::__cxx11::string::~string((string *)local_378);
            bVar2 = false;
          }
        }
        ReferenceChecker::~ReferenceChecker(&vis);
      }
      p_Var11 = p_Var12;
      while (p_Var11 = p_Var11->_M_nxt, p_Var11 != (__node_base *)0x0) {
        sVar4 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                ::count(&referenced._M_h,(key_type *)(p_Var11 + 1));
        if ((sVar4 == 0) && (*(long *)(log.super__Function_base._M_functor._8_8_ + 0x10) != 0)) {
          pVar15 = line_info((char *)n,(char *)p_Var11[9]._M_nxt);
          uVar8 = pVar15.second;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_378,"\'",(key_type *)(p_Var11 + 1));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vis,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_378,"\' is not referenced.");
          std::__cxx11::string::~string((string *)local_378);
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)local_378,"",(allocator<char> *)&local_240);
          std::
          function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          ::operator()((function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                        *)log.super__Function_base._M_functor._8_8_,pVar15.first,uVar8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vis,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_378);
          std::__cxx11::string::~string((string *)local_378);
          std::__cxx11::string::~string((string *)&vis);
        }
      }
      if (bVar2) {
        p_Var11 = p_Var12;
        while (p_Var11 = p_Var11->_M_nxt, p_Var11 != (__node_base *)0x0) {
          vis.error_s._M_h._M_bucket_count = (size_type)(p_Var11 + 0x23);
          vis.super_Visitor._vptr_Visitor = (_func_int **)&PTR__Visitor_0016a888;
          vis.error_s._M_h._M_buckets =
               (__buckets_ptr)
               data.grammar.
               super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
               ._M_ptr;
          (*(code *)(p_Var11[0x3d]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var11[0x3d]._M_nxt,&vis);
        }
        bVar2 = true;
        p_Var11 = p_Var12;
        while (p_Var11 = p_Var11->_M_nxt, p_Var11 != (__node_base *)0x0) {
          DetectLeftRecursion::DetectLeftRecursion
                    ((DetectLeftRecursion *)&vis,(string *)(p_Var11 + 1));
          (*(code *)(p_Var11[0x3d]._M_nxt)->_M_nxt[3]._M_nxt)(p_Var11[0x3d]._M_nxt,&vis);
          if (vis.error_s._M_h._M_buckets != (__buckets_ptr)0x0) {
            if (*(long *)(log.super__Function_base._M_functor._8_8_ + 0x10) != 0) {
              pVar15 = line_info((char *)n,(char *)vis.error_s._M_h._M_buckets);
              uVar8 = pVar15.second;
              std::operator+(&local_240,"\'",(string *)(p_Var11 + 1));
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_378,&local_240,"\' is left recursive.");
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_190,"",(allocator<char> *)&stack0xfffffffffffffc57);
              std::
              function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::operator()((function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                            *)log.super__Function_base._M_functor._8_8_,pVar15.first,uVar8,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           local_378,&local_190);
              std::__cxx11::string::~string((string *)&local_190);
              std::__cxx11::string::~string((string *)local_378);
              std::__cxx11::string::~string((string *)&local_240);
            }
            bVar2 = false;
          }
          DetectLeftRecursion::~DetectLeftRecursion((DetectLeftRecursion *)&vis);
        }
        if ((!bVar2) ||
           (bVar2 = detect_infiniteLoop((ParserGenerator *)local_378._32_8_,&data,pmVar3,
                                        (Log *)log.super__Function_base._M_functor._8_8_,(char *)n),
           bVar2)) goto LAB_0011317a;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&vis,"%whitespace",(allocator<char> *)local_378);
        sVar5 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::count(&(data.grammar.
                          super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->_M_h,(key_type *)&vis);
        std::__cxx11::string::~string((string *)&vis);
        if (sVar5 != 0) {
          while (p_Var12 = p_Var12->_M_nxt, p_Var12 != (__node_base *)0x0) {
            Definition::get_core_operator((Definition *)&vis);
            bVar2 = IsLiteralToken::check((Ope *)vis.super_Visitor._vptr_Visitor);
            if (bVar2) {
              tok((shared_ptr<peg::Ope> *)local_378);
              Definition::operator<=((Definition *)(p_Var12 + 5),(shared_ptr<peg::Ope> *)local_378);
              std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                        ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_378 + 8));
            }
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&vis.error_s);
          }
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&vis,"%whitespace",(allocator<char> *)local_378);
          pmVar6 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)data.grammar.
                                   super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,(key_type *)&vis);
          std::__cxx11::string::~string((string *)&vis);
          Definition::get_core_operator((Definition *)local_378);
          wsp((shared_ptr<peg::Ope> *)&vis);
          std::__shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(pmVar3->whitespaceOpe).
                      super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>,
                     (__shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2> *)&vis);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&vis.error_s);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_378 + 8));
          bVar2 = detect_infiniteLoop((ParserGenerator *)local_378._32_8_,&data,pmVar6,
                                      (Log *)log.super__Function_base._M_functor._8_8_,(char *)n);
          if (bVar2) goto LAB_0011317a;
        }
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&vis,"%word",(allocator<char> *)local_378);
        sVar5 = std::
                _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                ::count(&(data.grammar.
                          super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr)->_M_h,(key_type *)&vis);
        std::__cxx11::string::~string((string *)&vis);
        if (sVar5 != 0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&vis,"%word",(allocator<char> *)local_378);
          pmVar6 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)data.grammar.
                                   super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,(key_type *)&vis);
          std::__cxx11::string::~string((string *)&vis);
          Definition::get_core_operator((Definition *)&vis);
          std::__shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>::operator=
                    (&(pmVar3->wordOpe).super___shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2>,
                     (__shared_ptr<peg::Ope,_(__gnu_cxx::_Lock_policy)2> *)&vis);
          std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&vis.error_s);
          bVar2 = detect_infiniteLoop((ParserGenerator *)local_378._32_8_,&data,pmVar6,
                                      (Log *)log.super__Function_base._M_functor._8_8_,(char *)n);
          if (bVar2) goto LAB_0011317a;
        }
        for (p_Var7 = data.instructions._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
            (_Rb_tree_header *)p_Var7 != &data.instructions._M_t._M_impl.super__Rb_tree_header;
            p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
          pmVar3 = std::__detail::
                   _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                   ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                 *)data.grammar.
                                   super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr,(key_type *)(p_Var7 + 1));
          p_Var1 = p_Var7[2]._M_parent;
          this_01 = (string *)&pmVar3->error_message;
          for (__lhs = *(_Base_ptr *)(p_Var7 + 2); __lhs != p_Var1; __lhs = __lhs + 2) {
            bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)__lhs,"precedence");
            if (bVar2) {
              std::
              any_cast<std::map<std::basic_string_view<char,std::char_traits<char>>,std::pair<unsigned_long,char>,std::less<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,std::pair<unsigned_long,char>>>>>
                        ((map<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>_>
                          *)&vis,(any *)(__lhs + 1));
              std::
              function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              ::function(&local_50,
                         (function<void_(unsigned_long,_unsigned_long,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                          *)log.super__Function_base._M_functor._8_8_);
              bVar2 = apply_precedence_instruction
                                ((ParserGenerator *)local_378._32_8_,pmVar3,(BinOpeInfo *)&vis,
                                 (char *)n,&local_50);
              std::_Function_base::~_Function_base(&local_50.super__Function_base);
              if (!bVar2) {
                (this->g)._M_h._M_buckets = (__buckets_ptr)0x0;
                (this->g)._M_h._M_bucket_count = 0;
                std::
                _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>_>
                ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>_>
                             *)&vis);
                goto LAB_00113185;
              }
              std::
              _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>_>
              ::~_Rb_tree((_Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<unsigned_long,_char>_>_>_>
                           *)&vis);
            }
            else {
              bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)__lhs,"error_message");
              if (bVar2) {
                std::any_cast<std::__cxx11::string>
                          ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&vis
                           ,(any *)(__lhs + 1));
                std::__cxx11::string::operator=(this_01,(string *)&vis);
                std::__cxx11::string::~string((string *)&vis);
              }
              else {
                bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)__lhs,"no_ast_opt");
                if (bVar2) {
                  pmVar3->no_ast_opt = true;
                }
              }
            }
          }
        }
        std::__cxx11::string::_M_assign((string *)local_220);
        *log.super__Function_base._M_functor._M_unused._M_function_pointer =
             (_func_void)data.enablePackratParsing;
        std::
        __shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
        ::__shared_ptr((__shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
                        *)this,(__shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
                                *)&data);
      }
      else {
LAB_0011317a:
        (this->g)._M_h._M_buckets = (__buckets_ptr)0x0;
        (this->g)._M_h._M_bucket_count = 0;
      }
LAB_00113185:
      std::
      _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
      ::~_Hashtable(&referenced._M_h);
      goto LAB_00112df1;
    }
  }
  (this->g)._M_h._M_buckets = (__buckets_ptr)0x0;
  (this->g)._M_h._M_bucket_count = 0;
LAB_00112df1:
  ErrorInfo::~ErrorInfo(&r.error_info);
  std::any::reset((any *)local_250);
  Data::~Data(&data);
  sVar16.
  super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = extraout_RDX._M_pi;
  sVar16.
  super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = &this->g;
  return (shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>_>
          )sVar16.
           super___shared_ptr<std::unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_peg::Definition>_>_>,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

std::shared_ptr<Grammar> perform_core(const char *s, size_t n,
                                        const Rules &rules, std::string &start,
                                        bool &enablePackratParsing, Log log) {
    Data data;
    auto &grammar = *data.grammar;

    // Built-in macros
    {
      // `%recover`
      {
        auto &rule = grammar[RECOVER_DEFINITION_NAME];
        rule <= ref(grammar, "x", "", false, {});
        rule.name = RECOVER_DEFINITION_NAME;
        rule.s_ = "[native]";
        rule.ignoreSemanticValue = true;
        rule.is_macro = true;
        rule.params = {"x"};
      }
    }

    std::any dt = &data;
    auto r = g["Grammar"].parse(s, n, dt, nullptr, log);

    if (!r.ret) {
      if (log) {
        if (r.error_info.message_pos) {
          auto line = line_info(s, r.error_info.message_pos);
          log(line.first, line.second, r.error_info.message,
              r.error_info.label);
        } else {
          auto line = line_info(s, r.error_info.error_pos);
          log(line.first, line.second, "syntax error", r.error_info.label);
        }
      }
      return nullptr;
    }

    // User provided rules
    for (auto [user_name, user_rule] : rules) {
      auto name = user_name;
      auto ignore = false;
      if (!name.empty() && name[0] == '~') {
        ignore = true;
        name.erase(0, 1);
      }
      if (!name.empty()) {
        auto &rule = grammar[name];
        rule <= user_rule;
        rule.name = name;
        rule.ignoreSemanticValue = ignore;
      }
    }

    // Check duplicated definitions
    auto ret = true;

    if (!data.duplicates_of_definition.empty()) {
      for (const auto &[name, ptr] : data.duplicates_of_definition) {
        if (log) {
          auto line = line_info(s, ptr);
          log(line.first, line.second,
              "The definition '" + name + "' is already defined.", "");
        }
      }
      ret = false;
    }

    // Check duplicated instructions
    if (!data.duplicates_of_instruction.empty()) {
      for (const auto &[type, ptr] : data.duplicates_of_instruction) {
        if (log) {
          auto line = line_info(s, ptr);
          log(line.first, line.second,
              "The instruction '" + type + "' is already defined.", "");
        }
      }
      ret = false;
    }

    // Check undefined back references
    if (!data.undefined_back_references.empty()) {
      for (const auto &[name, ptr] : data.undefined_back_references) {
        if (log) {
          auto line = line_info(s, ptr);
          log(line.first, line.second,
              "The back reference '" + name + "' is undefined.", "");
        }
      }
      ret = false;
    }

    // Set root definition
    auto &start_rule = grammar[data.start];

    // Check if the start rule has ignore operator
    {
      if (start_rule.ignoreSemanticValue) {
        if (log) {
          auto line = line_info(s, start_rule.s_);
          log(line.first, line.second,
              "Ignore operator cannot be applied to '" + start_rule.name + "'.",
              "");
        }
        ret = false;
      }
    }

    if (!ret) { return nullptr; }

    // Check missing definitions
    auto referenced = std::unordered_set<std::string>{
        WHITESPACE_DEFINITION_NAME,
        WORD_DEFINITION_NAME,
        RECOVER_DEFINITION_NAME,
        start_rule.name,
    };

    for (auto &[_, rule] : grammar) {
      ReferenceChecker vis(grammar, rule.params);
      rule.accept(vis);
      referenced.insert(vis.referenced.begin(), vis.referenced.end());
      for (const auto &[name, ptr] : vis.error_s) {
        if (log) {
          auto line = line_info(s, ptr);
          log(line.first, line.second, vis.error_message[name], "");
        }
        ret = false;
      }
    }

    for (auto &[name, rule] : grammar) {
      if (!referenced.count(name)) {
        if (log) {
          auto line = line_info(s, rule.s_);
          auto msg = "'" + name + "' is not referenced.";
          log(line.first, line.second, msg, "");
        }
      }
    }

    if (!ret) { return nullptr; }

    // Link references
    for (auto &x : grammar) {
      auto &rule = x.second;
      LinkReferences vis(grammar, rule.params);
      rule.accept(vis);
    }

    // Check left recursion
    ret = true;

    for (auto &[name, rule] : grammar) {
      DetectLeftRecursion vis(name);
      rule.accept(vis);
      if (vis.error_s) {
        if (log) {
          auto line = line_info(s, vis.error_s);
          log(line.first, line.second, "'" + name + "' is left recursive.", "");
        }
        ret = false;
      }
    }

    if (!ret) { return nullptr; }

    // Check infinite loop
    if (detect_infiniteLoop(data, start_rule, log, s)) { return nullptr; }

    // Automatic whitespace skipping
    if (grammar.count(WHITESPACE_DEFINITION_NAME)) {
      for (auto &x : grammar) {
        auto &rule = x.second;
        auto ope = rule.get_core_operator();
        if (IsLiteralToken::check(*ope)) { rule <= tok(ope); }
      }

      auto &rule = grammar[WHITESPACE_DEFINITION_NAME];
      start_rule.whitespaceOpe = wsp(rule.get_core_operator());

      if (detect_infiniteLoop(data, rule, log, s)) { return nullptr; }
    }

    // Word expression
    if (grammar.count(WORD_DEFINITION_NAME)) {
      auto &rule = grammar[WORD_DEFINITION_NAME];
      start_rule.wordOpe = rule.get_core_operator();

      if (detect_infiniteLoop(data, rule, log, s)) { return nullptr; }
    }

    // Apply instructions
    for (const auto &[name, instructions] : data.instructions) {
      auto &rule = grammar[name];

      for (const auto &instruction : instructions) {
        if (instruction.type == "precedence") {
          const auto &info =
              std::any_cast<PrecedenceClimbing::BinOpeInfo>(instruction.data);

          if (!apply_precedence_instruction(rule, info, s, log)) {
            return nullptr;
          }
        } else if (instruction.type == "error_message") {
          rule.error_message = std::any_cast<std::string>(instruction.data);
        } else if (instruction.type == "no_ast_opt") {
          rule.no_ast_opt = true;
        }
      }
    }

    // Set root definition
    start = data.start;
    enablePackratParsing = data.enablePackratParsing;

    return data.grammar;
  }